

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::run(tests *specification,int argc,char **argv,ostream *os)

{
  int iVar1;
  texts local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<lest::test,_std::allocator<lest::test>_> local_40;
  ostream *local_28;
  ostream *os_local;
  char **argv_local;
  tests *ptStack_10;
  int argc_local;
  tests *specification_local;
  
  local_28 = os;
  os_local = (ostream *)argv;
  argv_local._4_4_ = argc;
  ptStack_10 = specification;
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_40,specification);
  make_texts_abi_cxx11_
            (&local_70,(lest *)(os_local + 8),(char **)(os_local + (long)argv_local._4_4_ * 8),
             (char **)(long)argv_local._4_4_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,&local_70);
  iVar1 = run(&local_40,&local_58,local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_40);
  return iVar1;
}

Assistant:

inline int run( tests const & specification, int argc, char ** argv, std::ostream & os = std::cout )
{
    return run( specification, make_texts( argv + 1, argv + argc ), os  );
}